

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate(cmGeneratorExpressionEvaluationFile *this)

{
  cmMakefile *pcVar1;
  cmCompiledGeneratorExpression *__x;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  cmGlobalGenerator *this_00;
  string *psVar5;
  string *psVar6;
  string *lang;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  mode_t perm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigs;
  auto_ptr<cmCompiledGeneratorExpression> inputExpression;
  cmGeneratorExpression contentGE;
  string inputContent;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  outputFiles;
  cmListFileBacktrace lfbt;
  undefined1 local_458 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  undefined1 local_428 [40];
  auto_ptr<cmCompiledGeneratorExpression> local_400;
  undefined1 local_3f8 [8];
  char *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  string local_3d0;
  undefined1 local_3b0 [8];
  undefined1 local_3a8 [8];
  undefined1 local_3a0 [24];
  _Alloc_hider local_388;
  ios_base local_340 [264];
  undefined1 local_238 [32];
  pointer pcStack_218;
  PositionType local_210;
  
  local_438._12_4_ = 0;
  local_3f0 = local_3e8._M_local_buf + 8;
  local_3e8._M_allocated_capacity = 0;
  local_3e8._M_local_buf[8] = '\0';
  local_438._M_allocated_capacity = (size_type)this;
  if (this->InputIsContent == true) {
    std::__cxx11::string::_M_assign((string *)&local_3f0);
  }
  else {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)local_238,(this->Input)._M_dataplus._M_p,(allocator *)local_3b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar1->ListFiles,(value_type *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    uVar2 = local_438._M_allocated_capacity;
    cmsys::SystemTools::GetPermissions
              (*(char **)local_438._M_allocated_capacity,(mode_t *)(local_438._M_local_buf + 0xc));
    std::ifstream::ifstream(local_238,*(char **)uVar2,_S_in);
    if ((*(byte *)((long)&pcStack_218 + *(long *)(local_238._0_8_ + -0x18)) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Evaluation file \"",0x11);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b0,*(char **)local_438._M_allocated_capacity,
                          *(size_type *)(local_438._M_allocated_capacity + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" cannot be read.",0x11);
      pcVar1 = *(cmMakefile **)(local_438._M_allocated_capacity + 0x28);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_458);
      if ((string *)local_458._0_8_ != (string *)(local_458 + 0x10)) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      std::ifstream::~ifstream(local_238);
      goto LAB_004426f2;
    }
    local_3b0 = (undefined1  [8])local_3a0;
    local_3a8 = (undefined1  [8])0x0;
    local_3a0._0_8_ = local_3a0._0_8_ & 0xffffffffffffff00;
    local_458._0_8_ = local_458 + 0x10;
    local_458._8_8_ = (string *)0x0;
    local_458._16_8_ = local_458._16_8_ & 0xffffffffffffff00;
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_238,(string *)local_3b0,(bool *)0x0,-1), bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458,
                     (string *)local_3b0);
      std::__cxx11::string::_M_append((char *)&local_3f0,local_428._0_8_);
      if ((string *)local_428._0_8_ != (string *)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
      }
      std::__cxx11::string::_M_replace((ulong)local_458,0,(char *)local_458._8_8_,0x5df0a3);
    }
    std::__cxx11::string::_M_append((char *)&local_3f0,local_458._0_8_);
    if ((string *)local_458._0_8_ != (string *)(local_458 + 0x10)) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    if (local_3b0 != (undefined1  [8])local_3a0) {
      operator_delete((void *)local_3b0,(ulong)(local_3a0._0_8_ + 1));
    }
    std::ifstream::~ifstream(local_238);
    this = (cmGeneratorExpressionEvaluationFile *)local_438._M_allocated_capacity;
  }
  __x = (this->OutputFileExpr).x_;
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
            ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_238,
             (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)__x);
  local_210 = (__x->Backtrace).Snapshot.Position.Position;
  local_238._24_8_ = (__x->Backtrace).Snapshot.State;
  pcStack_218 = (pointer)(__x->Backtrace).Snapshot.Position.Tree;
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_3f8,(cmListFileBacktrace *)local_238);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_3b0,(string *)local_3f8);
  local_400.x_ = (cmCompiledGeneratorExpression *)local_3b0;
  local_3b0 = (undefined1  [8])0x0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_3b0);
  local_3a0._8_8_ = local_3a8;
  local_3a8 = (undefined1  [8])((ulong)local_3a8 & 0xffffffff00000000);
  local_3a0._0_8_ = (pointer)0x0;
  local_388._M_p = (pointer)0x0;
  local_428._16_8_ = 0;
  local_428._0_8_ = (string *)0x0;
  local_428._8_8_ = (string *)0x0;
  local_3a0._16_8_ = local_3a0._8_8_;
  cmMakefile::GetConfigurations
            (&local_3d0,*(cmMakefile **)(local_438._M_allocated_capacity + 0x28),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_428,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if (local_428._0_8_ == local_428._8_8_) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_428,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
  }
  local_458._0_8_ = (string *)0x0;
  local_458._8_8_ = (string *)0x0;
  local_458._16_8_ = 0;
  this_00 = cmMakefile::GetGlobalGenerator(*(cmMakefile **)(local_438._M_allocated_capacity + 0x28))
  ;
  cmGlobalGenerator::GetEnabledLanguages
            (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
  if (local_458._0_8_ != local_458._8_8_) {
    psVar5 = (string *)local_458._8_8_;
    psVar6 = (string *)local_428._8_8_;
    lang = (string *)local_458._0_8_;
    do {
      config = (string *)local_428._0_8_;
      if ((string *)local_428._0_8_ != psVar6) {
        do {
          Generate((cmGeneratorExpressionEvaluationFile *)local_438._M_allocated_capacity,config,
                   lang,local_400.x_,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3b0,local_438._12_4_);
          if ((cmSystemTools::s_FatalErrorOccured != false) ||
             (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) goto LAB_004426b2;
          psVar6 = config + 1;
          psVar5 = (string *)local_458._8_8_;
          config = psVar6;
        } while (psVar6 != (string *)local_428._8_8_);
      }
      lang = lang + 1;
    } while (lang != psVar5);
  }
LAB_004426b2:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_458);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3b0);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_400);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_3f8);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_238);
LAB_004426f2:
  if (local_3f0 != local_3e8._M_local_buf + 8) {
    operator_delete(local_3f0,CONCAT71(local_3e8._9_7_,local_3e8._M_local_buf[8]) + 1);
  }
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate()
{
  mode_t perm = 0;
  std::string inputContent;
  if (this->InputIsContent)
    {
    inputContent = this->Input;
    }
  else
    {
    this->Makefile->AddCMakeDependFile(this->Input.c_str());
    cmSystemTools::GetPermissions(this->Input.c_str(), perm);
    cmsys::ifstream fin(this->Input.c_str());
    if(!fin)
      {
      std::ostringstream e;
      e << "Evaluation file \"" << this->Input << "\" cannot be read.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }

    std::string line;
    std::string sep;
    while(cmSystemTools::GetLineFromStream(fin, line))
      {
      inputContent += sep + line;
      sep = "\n";
      }
    inputContent += sep;
    }

  cmListFileBacktrace lfbt = this->OutputFileExpr->GetBacktrace();
  cmGeneratorExpression contentGE(&lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> inputExpression
                                              = contentGE.Parse(inputContent);

  std::map<std::string, std::string> outputFiles;

  std::vector<std::string> allConfigs;
  this->Makefile->GetConfigurations(allConfigs);

  if (allConfigs.empty())
    {
    allConfigs.push_back("");
    }

  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for(std::vector<std::string>::const_iterator le = enabledLanguages.begin();
      le != enabledLanguages.end(); ++le)
    {
    for(std::vector<std::string>::const_iterator li = allConfigs.begin();
        li != allConfigs.end(); ++li)
      {
      this->Generate(*li, *le, inputExpression.get(), outputFiles, perm);
      if(cmSystemTools::GetFatalErrorOccured())
        {
        return;
        }
      }
    }
}